

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::CheckerInstantiationSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,CheckerInstantiationSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *node;
  SyntaxNode *local_60;
  SyntaxNode *local_50;
  size_t index_local;
  CheckerInstantiationSyntax *this_local;
  
  switch(index) {
  case 0:
    local_50 = (SyntaxNode *)0x0;
    if (this != (CheckerInstantiationSyntax *)0xfffffffffffffff0) {
      local_50 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_50);
    break;
  case 1:
    node = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&this->type);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 2:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->parameters->super_SyntaxNode);
    break;
  case 3:
    local_60 = (SyntaxNode *)0x0;
    if (this != (CheckerInstantiationSyntax *)0xffffffffffffffb0) {
      local_60 = &(this->instances).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_60);
    break;
  case 4:
    token.kind = (this->semi).kind;
    token._2_1_ = (this->semi).field_0x2;
    token.numFlags.raw = (this->semi).numFlags.raw;
    token.rawLen = (this->semi).rawLen;
    token.info = (this->semi).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax CheckerInstantiationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return type.get();
        case 2: return parameters;
        case 3: return &instances;
        case 4: return semi;
        default: return nullptr;
    }
}